

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::insert
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this,
          BindingMap *svBindings,LeafData *ld)

{
  uint var_00;
  long *plVar1;
  UnresolvedSplitRecord obj;
  TermList ts;
  TermList ts_00;
  TermList ts_01;
  TermList val;
  Node *pNVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  IntermediateNode *pIVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TermList *pTVar8;
  undefined4 extraout_var_01;
  Leaf *pLVar9;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *in_RSI;
  uint *in_RDI;
  UnresolvedSplitRecord UVar10;
  Elem EVar11;
  Binding BVar12;
  Top TVar13;
  Leaf *leaf_1;
  uint x;
  Term *t;
  Term *s;
  Stack<Kernel::TermList_*> subterms;
  TermList *ss;
  TermList *tt;
  Leaf *lnode;
  IntermediateNode *inode_2;
  Binding b;
  TermList *term_2;
  uint *var;
  StlIter __end3;
  StlIter __begin3;
  IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
  *__range3;
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
  remainingBindings;
  Node **pparent;
  TermList term;
  uint boundVar;
  IntermediateNode *inode;
  Node **nodePosition;
  IntermediateNode *newNode;
  Node *node;
  UnresolvedSplitRecord urr;
  bool wouldDescendIntoChild;
  TermList term_1;
  bool removeProblematicNode;
  Node *child;
  uint boundVar_1;
  UArrIntermediateNode *inode_1;
  bool canPostponeSplits;
  Leaf *leaf;
  Node **pnode;
  undefined4 in_stack_fffffffffffffa68;
  uint in_stack_fffffffffffffa6c;
  TermList in_stack_fffffffffffffa70;
  TermList in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa84;
  undefined1 in_stack_fffffffffffffa85;
  undefined1 in_stack_fffffffffffffa86;
  undefined1 in_stack_fffffffffffffa87;
  Term *in_stack_fffffffffffffa88;
  undefined7 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa97;
  Term *in_stack_fffffffffffffa98;
  Term *in_stack_fffffffffffffaa0;
  int local_47c;
  undefined1 local_448 [48];
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *local_418;
  Entry *local_410;
  uint64_t local_408;
  UnresolvedSplitRecord local_400;
  uint local_3ec;
  Entry *local_3e8;
  uint64_t local_3e0;
  Term *local_3d8;
  Term *local_3d0;
  Entry *local_3c8;
  uint64_t local_3c0;
  Stack<Kernel::TermList_*> local_3b8;
  TermList *local_398;
  Entry **local_390;
  undefined1 local_358 [48];
  Entry *local_328;
  Leaf *local_320;
  undefined8 local_318;
  uint local_310;
  undefined8 local_308;
  uint local_300;
  undefined8 local_2f8;
  uint local_2f0;
  Entry *local_2e8;
  IntermediateNode *local_2e0;
  uint local_2d8;
  Entry *local_2d0;
  uint64_t local_2c8;
  Binding local_2c0;
  TermList *local_2b0;
  uint *local_2a8;
  Elem local_2a0;
  undefined1 local_248 [8];
  undefined1 *local_240;
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
  local_238;
  undefined8 local_220;
  undefined4 local_218;
  undefined8 local_210;
  undefined4 local_208;
  undefined8 local_1fc;
  undefined4 local_1f4;
  uint *local_1f0;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> local_1e8;
  long *local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined8 local_1a8;
  undefined4 local_1a0;
  undefined8 local_194;
  undefined4 local_18c;
  undefined8 *local_188;
  uint64_t local_180;
  uint64_t local_178;
  IntermediateNode *local_170;
  Node *local_168;
  uint local_160;
  TermList local_158;
  uint64_t local_150;
  uint64_t local_148;
  UnresolvedSplitRecord local_140;
  undefined8 local_130;
  undefined4 local_128;
  undefined8 local_120;
  undefined4 local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined1 local_101;
  uint64_t local_100;
  byte local_e9;
  Node *local_e8;
  undefined4 local_dc;
  Node *local_d8;
  byte local_c9;
  undefined1 local_98 [64];
  undefined1 local_58 [48];
  Leaf *local_28;
  uint *local_20;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *local_10;
  
  local_20 = in_RDI + 2;
  local_10 = in_RSI;
  if (*(long *)local_20 == 0) {
    bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::isEmpty
                      (in_RSI);
    if (bVar3) {
      pLVar9 = createLeaf();
      local_28 = pLVar9;
      Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs
                ((Lhs *)in_stack_fffffffffffffa70._content,
                 (Lhs *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      (*(pLVar9->super_Node)._vptr_Node[9])(pLVar9,local_58);
      Inferences::ALASCA::FourierMotzkinConf::Lhs::~Lhs((Lhs *)0x3ddced);
      *(Leaf **)local_20 = local_28;
      return;
    }
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::getOneKey
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
               CONCAT17(in_stack_fffffffffffffa87,
                        CONCAT16(in_stack_fffffffffffffa86,
                                 CONCAT15(in_stack_fffffffffffffa85,
                                          CONCAT14(in_stack_fffffffffffffa84,
                                                   in_stack_fffffffffffffa80)))));
    pIVar6 = createIntermediateNode
                       (CONCAT13(in_stack_fffffffffffffa87,
                                 CONCAT12(in_stack_fffffffffffffa86,
                                          CONCAT11(in_stack_fffffffffffffa85,
                                                   in_stack_fffffffffffffa84))));
    *(IntermediateNode **)local_20 = pIVar6;
  }
  bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::isEmpty
                    (local_10);
  if (bVar3) {
    ensureLeafEfficiency((Leaf **)0x3ddd72);
    plVar1 = *(long **)local_20;
    Kernel::SelectedSummand::SelectedSummand
              ((SelectedSummand *)in_stack_fffffffffffffa70._content,
               (SelectedSummand *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs
              ((Lhs *)in_stack_fffffffffffffa70._content,
               (SelectedSummand *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    (**(code **)(*plVar1 + 0x48))(plVar1,local_98);
    Inferences::ALASCA::FourierMotzkinConf::Lhs::~Lhs((Lhs *)0x3ddde1);
    Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x3dddee);
  }
  else {
    if ((insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::FourierMotzkinConf::Lhs)
         ::unresolvedSplits == '\0') &&
       (iVar5 = __cxa_guard_acquire(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::FourierMotzkinConf::Lhs)
                                     ::unresolvedSplits), iVar5 != 0)) {
      Lib::
      BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
      ::BinaryHeap(&insert::unresolvedSplits);
      __cxa_atexit(Lib::
                   BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                   ::~BinaryHeap,&insert::unresolvedSplits,&__dso_handle);
      __cxa_guard_release(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::FourierMotzkinConf::Lhs)
                           ::unresolvedSplits);
    }
    Lib::
    BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
    ::reset(&insert::unresolvedSplits);
LAB_003dde96:
    do {
      local_c9 = 0;
      uVar7 = (**(code **)(**(long **)local_20 + 0x10))();
      if (((uVar7 & 1) == 0) && (iVar5 = (**(code **)(**(long **)local_20 + 0x28))(), iVar5 == 1)) {
        local_d8 = *(Node **)local_20;
        iVar5 = (*local_d8->_vptr_Node[4])();
        local_c9 = iVar5 == 1;
        if ((bool)local_c9) {
          local_dc = *(undefined4 *)&local_d8[1]._vptr_Node;
          local_e8 = (Node *)local_d8[1]._term._content;
          local_e9 = 0;
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::find
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                     in_stack_fffffffffffffa88,
                     (uint *)CONCAT17(in_stack_fffffffffffffa87,
                                      CONCAT16(in_stack_fffffffffffffa86,
                                               CONCAT15(in_stack_fffffffffffffa85,
                                                        CONCAT14(in_stack_fffffffffffffa84,
                                                                 in_stack_fffffffffffffa80)))));
          bVar3 = Lib::Option::operator_cast_to_bool((Option<Kernel::TermList_&> *)0x3ddf91);
          if (bVar3) {
            pTVar8 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                     ::get((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                            *)in_stack_fffffffffffffa70._content,in_stack_fffffffffffffa6c);
            pNVar2 = local_d8;
            local_100 = pTVar8->_content;
            TVar13 = Kernel::TermList::top((TermList *)in_stack_fffffffffffffaa0);
            local_130 = TVar13._inner._inner._0_8_;
            local_118 = CONCAT31(local_118._1_3_,TVar13._inner._inner._content[7]);
            local_108 = local_118;
            local_128 = local_118;
            local_120 = local_130;
            local_110 = local_130;
            iVar5 = (*pNVar2->_vptr_Node[10])
                              (pNVar2,local_130,(ulong)TVar13._inner._inner._content[7],0);
            local_101 = CONCAT44(extraout_var,iVar5) != 0;
            if (!(bool)local_101) {
              local_e9 = 1;
            }
          }
          else {
            Node::term(local_e8);
            bVar3 = Kernel::TermList::isTerm((TermList *)0x3de07c);
            if (bVar3) {
              Node::term(local_e8);
              Kernel::TermList::term((TermList *)0x3de097);
              bVar3 = Kernel::Term::shared((Term *)0x3de09f);
              if (!bVar3) {
                local_c9 = 0;
                goto LAB_003de0b9;
              }
            }
            local_e9 = 1;
          }
LAB_003de0b9:
          if ((local_e9 & 1) != 0) {
            var_00 = *(uint *)&local_d8[1]._vptr_Node;
            pTVar8 = Node::term(local_e8);
            local_148 = pTVar8->_content;
            UnresolvedSplitRecord::UnresolvedSplitRecord(&local_140,var_00,(TermList)local_148);
            UVar10.original._content._0_4_ = in_stack_fffffffffffffa80;
            UVar10._0_8_ = in_stack_fffffffffffffa78._content;
            UVar10.original._content._4_1_ = in_stack_fffffffffffffa84;
            UVar10.original._content._5_1_ = in_stack_fffffffffffffa85;
            UVar10.original._content._6_1_ = in_stack_fffffffffffffa86;
            UVar10.original._content._7_1_ = in_stack_fffffffffffffa87;
            Lib::
            BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
            ::insert((BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                      *)in_stack_fffffffffffffa70._content,UVar10);
            pNVar2 = local_e8;
            pTVar8 = Node::term(local_d8);
            local_150 = pTVar8->_content;
            Node::setTerm(pNVar2,(TermList)local_150);
            *(Node **)local_20 = local_e8;
            IntermediateNode::makeEmpty((IntermediateNode *)in_stack_fffffffffffffa70._content);
            if (local_d8 != (Node *)0x0) {
              (*local_d8->_vptr_Node[1])();
            }
            goto LAB_003dde96;
          }
        }
      }
      else {
        local_c9 = 0;
      }
      bVar4 = Lib::
              BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
              ::isEmpty(&insert::unresolvedSplits);
      bVar3 = (local_c9 & 1) != 0;
      local_c9 = bVar3 || bVar4;
      if (!bVar3 && !bVar4) {
        while (bVar3 = Lib::
                       BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                       ::isEmpty(&insert::unresolvedSplits), ((bVar3 ^ 0xffU) & 1) != 0) {
          UVar10 = Lib::
                   BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                   ::pop((BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                          *)in_stack_fffffffffffffa70._content);
          local_158 = UVar10.original._content;
          local_160 = UVar10.var;
          local_168 = *(Node **)local_20;
          pTVar8 = Node::term(local_168);
          local_178 = pTVar8->_content;
          ts_00._content._7_1_ = in_stack_fffffffffffffa97;
          ts_00._content._0_7_ = in_stack_fffffffffffffa90;
          local_170 = createIntermediateNode(ts_00,(uint)((ulong)in_stack_fffffffffffffa88 >> 0x20))
          ;
          local_180 = local_158._content;
          Node::setTerm(local_168,local_158);
          pIVar6 = local_170;
          *(IntermediateNode **)local_20 = local_170;
          TVar13 = Node::top((Node *)CONCAT17(in_stack_fffffffffffffa87,
                                              CONCAT16(in_stack_fffffffffffffa86,
                                                       CONCAT15(in_stack_fffffffffffffa85,
                                                                CONCAT14(in_stack_fffffffffffffa84,
                                                                         in_stack_fffffffffffffa80))
                                                      )));
          local_1b8 = TVar13._inner._inner._0_8_;
          local_1a0 = CONCAT31(local_1a0._1_3_,TVar13._inner._inner._content[7]);
          local_18c = local_1a0;
          local_1b0 = local_1a0;
          local_1a8 = local_1b8;
          local_194 = local_1b8;
          iVar5 = (*(pIVar6->super_Node)._vptr_Node[10])
                            (pIVar6,local_1b8,(ulong)TVar13._inner._inner._content[7],1);
          local_188 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
          *local_188 = local_168;
        }
      }
      local_1c0 = *(long **)local_20;
      local_1e8._afterLast._4_4_ = (undefined4)local_1c0[2];
      pTVar8 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::get
                         ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                           *)in_stack_fffffffffffffa70._content,in_stack_fffffffffffffa6c);
      local_1e8._entries = (Entry *)pTVar8->_content;
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::remove
                (&local_1e8,(char *)local_10);
      Lib::Option<std::pair<unsigned_int,_Kernel::TermList>_>::~Option
                ((Option<std::pair<unsigned_int,_Kernel::TermList>_> *)0x3de3c6);
      plVar1 = local_1c0;
      local_1f0 = local_20;
      TVar13 = Kernel::TermList::top((TermList *)in_stack_fffffffffffffaa0);
      local_220 = TVar13._inner._inner._0_8_;
      local_208 = CONCAT31(local_208._1_3_,TVar13._inner._inner._content[7]);
      local_1f4 = local_208;
      local_218 = local_208;
      local_210 = local_220;
      local_1fc = local_220;
      local_20 = (uint *)(**(code **)(*plVar1 + 0x50))
                                   (plVar1,local_220,TVar13._inner._inner._content[7]);
      if (*(long *)local_20 == 0) {
        Lib::
        BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
        ::BinaryHeap(&local_238);
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::items
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                   in_stack_fffffffffffffa98);
        Lib::
        iterTraits<Lib::VirtualIterator<std::pair<unsigned_int_const&,Kernel::TermList_const&>>>
                  ((VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_> *)
                   in_stack_fffffffffffffa98);
        Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>::
        ~VirtualIterator((VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                          *)in_stack_fffffffffffffa70._content);
        local_240 = local_248;
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::begin((IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                 *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::end((IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
               *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        while( true ) {
          bVar3 = Lib::operator!=((StlIter *)in_stack_fffffffffffffa70._content,
                                  (StlIter *)
                                  CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          if (!bVar3) break;
          EVar11 = Lib::
                   IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                   ::StlIter::operator*((StlIter *)0x3de604);
          local_2a0 = EVar11;
          local_2a8 = std::get<0ul,unsigned_int_const&,Kernel::TermList_const&>
                                ((pair<const_unsigned_int_&,_const_Kernel::TermList_&> *)0x3de64b);
          local_2b0 = std::get<1ul,unsigned_int_const&,Kernel::TermList_const&>
                                ((pair<const_unsigned_int_&,_const_Kernel::TermList_&> *)0x3de660);
          local_2c8 = local_2b0->_content;
          Binding::Binding(&local_2c0,*local_2a8,(TermList)local_2c8);
          BVar12.term._content._0_4_ = in_stack_fffffffffffffa80;
          BVar12._0_8_ = in_stack_fffffffffffffa78._content;
          BVar12.term._content._4_1_ = in_stack_fffffffffffffa84;
          BVar12.term._content._5_1_ = in_stack_fffffffffffffa85;
          BVar12.term._content._6_1_ = in_stack_fffffffffffffa86;
          BVar12.term._content._7_1_ = in_stack_fffffffffffffa87;
          Lib::
          BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
          ::insert((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                    *)in_stack_fffffffffffffa70._content,BVar12);
          Lib::
          IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
          ::StlIter::operator++((StlIter *)in_stack_fffffffffffffaa0);
        }
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::StlIter::~StlIter((StlIter *)0x3de541);
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::StlIter::~StlIter((StlIter *)0x3de54e);
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::~IterTraits((IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                       *)0x3de55b);
        while( true ) {
          bVar3 = Lib::
                  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                  ::isEmpty(&local_238);
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          BVar12 = Lib::
                   BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                   ::pop((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                          *)in_stack_fffffffffffffa70._content);
          local_2d0 = (Entry *)BVar12.term._content;
          local_2d8 = BVar12.var;
          local_2e8 = local_1e8._entries;
          ts_01._content._7_1_ = in_stack_fffffffffffffa97;
          ts_01._content._0_7_ = in_stack_fffffffffffffa90;
          pIVar6 = createIntermediateNode(ts_01,(uint)((ulong)in_stack_fffffffffffffa88 >> 0x20));
          local_1e8._entries = local_2d0;
          *(IntermediateNode **)local_20 = pIVar6;
          local_2e0 = pIVar6;
          TVar13 = Kernel::TermList::top((TermList *)in_stack_fffffffffffffaa0);
          local_318 = TVar13._inner._inner._0_8_;
          local_300 = CONCAT31(local_300._1_3_,TVar13._inner._inner._content[7]);
          local_2f0 = local_300;
          local_310 = local_300;
          local_308 = local_318;
          local_2f8 = local_318;
          iVar5 = (*(pIVar6->super_Node)._vptr_Node[10])(pIVar6,local_318,(ulong)local_300,1);
          local_20 = (uint *)CONCAT44(extraout_var_01,iVar5);
        }
        local_328 = local_1e8._entries;
        ts._content._4_1_ = in_stack_fffffffffffffa84;
        ts._content._0_4_ = in_stack_fffffffffffffa80;
        ts._content._5_1_ = in_stack_fffffffffffffa85;
        ts._content._6_1_ = in_stack_fffffffffffffa86;
        ts._content._7_1_ = in_stack_fffffffffffffa87;
        pLVar9 = createLeaf(ts);
        *(Leaf **)local_20 = pLVar9;
        local_320 = pLVar9;
        Kernel::SelectedSummand::SelectedSummand
                  ((SelectedSummand *)in_stack_fffffffffffffa70._content,
                   (SelectedSummand *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68))
        ;
        Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs
                  ((Lhs *)in_stack_fffffffffffffa70._content,
                   (SelectedSummand *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68))
        ;
        (*(pLVar9->super_Node)._vptr_Node[9])(pLVar9,local_358);
        Inferences::ALASCA::FourierMotzkinConf::Lhs::~Lhs((Lhs *)0x3de908);
        Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x3de915);
        ensureIntermediateNodeEfficiency((IntermediateNode **)0x3de922);
        Lib::
        BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
        ::~BinaryHeap((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                       *)in_stack_fffffffffffffa70._content);
        return;
      }
      local_390 = &local_1e8._entries;
      local_398 = Node::term(*(Node **)local_20);
      Lib::Stack<Kernel::TermList_*>::Stack
                ((Stack<Kernel::TermList_*> *)
                 CONCAT17(in_stack_fffffffffffffa87,
                          CONCAT16(in_stack_fffffffffffffa86,
                                   CONCAT15(in_stack_fffffffffffffa85,
                                            CONCAT14(in_stack_fffffffffffffa84,
                                                     in_stack_fffffffffffffa80)))),
                 in_stack_fffffffffffffa78._content);
LAB_003de9c6:
      while (bVar3 = Kernel::TermList::operator!=((TermList *)local_390,local_398), bVar3) {
        local_3c0 = local_398->_content;
        local_3c8 = *local_390;
        bVar3 = Kernel::TermList::sameTop(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
        if (!bVar3) break;
        in_stack_fffffffffffffaa0 = Kernel::TermList::term((TermList *)0x3dea3f);
        local_3d0 = in_stack_fffffffffffffaa0;
        in_stack_fffffffffffffa98 = Kernel::TermList::term((TermList *)0x3dea60);
        local_3d8 = in_stack_fffffffffffffa98;
        in_stack_fffffffffffffa97 = Kernel::Term::shared((Term *)0x3dea81);
        if ((bool)in_stack_fffffffffffffa97) {
          in_stack_fffffffffffffa88 =
               Kernel::Term::cloneNonShared
                         ((Term *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90));
          local_3d0 = in_stack_fffffffffffffa88;
          Kernel::TermList::setTerm
                    ((TermList *)in_stack_fffffffffffffa70._content,
                     (Term *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        }
        local_398 = Kernel::Term::args(local_3d0);
        local_390 = (Entry **)Kernel::Term::args(local_3d8);
        Kernel::TermList::next(local_398);
        in_stack_fffffffffffffa87 = Kernel::TermList::isEmpty((TermList *)0x3deb23);
        if (!(bool)in_stack_fffffffffffffa87) {
          Kernel::TermList::next(local_398);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffa70._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          Kernel::TermList::next((TermList *)local_390);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffa70._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        }
      }
      local_3e0 = local_398->_content;
      local_3e8 = *local_390;
      in_stack_fffffffffffffa86 =
           Kernel::TermList::sameTop(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
      if (!(bool)in_stack_fffffffffffffa86) {
        in_stack_fffffffffffffa85 = Kernel::TermList::isSpecialVar((TermList *)0x3debd7);
        if ((bool)in_stack_fffffffffffffa85) {
          local_3ec = Kernel::TermList::var(local_398);
        }
        else {
          local_3ec = *in_RDI;
          *in_RDI = local_3ec + 1;
          local_408 = local_398->_content;
          UnresolvedSplitRecord::UnresolvedSplitRecord(&local_400,local_3ec,(TermList)local_408);
          obj.original._content._0_4_ = in_stack_fffffffffffffa80;
          obj._0_8_ = in_stack_fffffffffffffa78._content;
          obj.original._content._4_1_ = in_stack_fffffffffffffa84;
          obj.original._content._5_1_ = in_stack_fffffffffffffa85;
          obj.original._content._6_1_ = in_stack_fffffffffffffa86;
          obj.original._content._7_1_ = in_stack_fffffffffffffa87;
          Lib::
          BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
          ::insert((BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
                    *)in_stack_fffffffffffffa70._content,obj);
          Kernel::TermList::makeSpecialVar(local_398,local_3ec);
        }
        local_410 = *local_390;
        val._content._7_1_ = in_stack_fffffffffffffa97;
        val._content._0_7_ = in_stack_fffffffffffffa90;
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                   in_stack_fffffffffffffa88,
                   CONCAT13(in_stack_fffffffffffffa87,
                            CONCAT12(in_stack_fffffffffffffa86,
                                     CONCAT11(in_stack_fffffffffffffa85,in_stack_fffffffffffffa84)))
                   ,val);
      }
      bVar3 = Lib::Stack<Kernel::TermList_*>::isEmpty(&local_3b8);
      if (!bVar3) {
        in_stack_fffffffffffffa78._content = (uint64_t)&local_3b8;
        local_390 = (Entry **)
                    Lib::Stack<Kernel::TermList_*>::pop
                              ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffa78._content);
        local_398 = Lib::Stack<Kernel::TermList_*>::pop
                              ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffa78._content);
        Kernel::TermList::next(local_398);
        in_stack_fffffffffffffa84 = Kernel::TermList::isEmpty((TermList *)0x3ded02);
        if (!(bool)in_stack_fffffffffffffa84) {
          Kernel::TermList::next(local_398);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffa70._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          Kernel::TermList::next((TermList *)local_390);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffa70._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        }
        goto LAB_003de9c6;
      }
      bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
              isEmpty(local_10);
      if (bVar3) {
        ensureLeafEfficiency((Leaf **)0x3ded7c);
        in_stack_fffffffffffffa70._content = *(uint64_t *)local_20;
        local_418 = (DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                    in_stack_fffffffffffffa70._content;
        Kernel::SelectedSummand::SelectedSummand
                  ((SelectedSummand *)in_stack_fffffffffffffa70._content,
                   (SelectedSummand *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68))
        ;
        Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs
                  ((Lhs *)in_stack_fffffffffffffa70._content,
                   (SelectedSummand *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68))
        ;
        (**(code **)(*(long *)in_stack_fffffffffffffa70._content + 0x48))
                  (in_stack_fffffffffffffa70._content,local_448);
        Inferences::ALASCA::FourierMotzkinConf::Lhs::~Lhs((Lhs *)0x3dedf1);
        Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x3dedfe);
        local_47c = 1;
      }
      else {
        local_47c = 2;
      }
      Lib::Stack<Kernel::TermList_*>::~Stack
                ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffa70._content);
    } while (local_47c != 1);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::insert(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_INSERT(0, "insert: ", svBindings, " into ", *this)

  if(*pnode == 0) {
    if (svBindings.isEmpty()) {
      auto leaf = createLeaf();
      leaf->insert(std::move(ld));
      *pnode = leaf;
      DEBUG_INSERT(0, "out: ", *this);
      return;
    } else {
      *pnode=createIntermediateNode(svBindings.getOneKey());
    }
  }
  if(svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    static_cast<Leaf*>(*pnode)->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  typedef BinaryHeap<UnresolvedSplitRecord, BindingComparator<LeafData_>> SplitRecordHeap;
  static SplitRecordHeap unresolvedSplits;
  unresolvedSplits.reset();

  ASS((*pnode));
  ASS(!(*pnode)->isLeaf());

start:

#if REORDERING
  ASS(!(*pnode)->isLeaf() || !unresolvedSplits.isEmpty());
  bool canPostponeSplits=false;
  if((*pnode)->isLeaf() || (*pnode)->algorithm()!=UNSORTED_LIST) {
    canPostponeSplits=false;
  } else {
    UArrIntermediateNode* inode = static_cast<UArrIntermediateNode*>(*pnode);
    canPostponeSplits = inode->size()==1;
    if(canPostponeSplits) {
      unsigned boundVar=inode->childVar;
      Node* child=inode->_nodes[0];
      bool removeProblematicNode=false;
      if(svBindings.find(boundVar)) {
	TermList term=svBindings.get(boundVar);
	bool wouldDescendIntoChild = inode->childByTop(term.top(),false)!=0;
	ASS_EQ(wouldDescendIntoChild, TermList::sameTop(term, child->term()));
	if(!wouldDescendIntoChild) {
	  //if we'd have to perform all postponed splitting due to
	  //node with a single child, we rather remove that node
	  //from the tree and deal with the binding, it represented,
	  //later.
	  removeProblematicNode=true;
	}
      } else if(!child->term().isTerm() || child->term().term()->shared()) {
	//We can remove nodes binding to special variables undefined in our branch
	//of the tree, as long as we're sure, that during split resolving we put these
	//binding nodes below nodes that define spec. variables they bind.
	removeProblematicNode=true;
      } else {
	canPostponeSplits = false;
      }
      if(removeProblematicNode) {
	unresolvedSplits.insert(UnresolvedSplitRecord(inode->childVar, child->term()));
	child->setTerm(inode->term());
	*pnode=child;
	inode->makeEmpty();
	delete inode;
	goto start;
      }
    }
  }
  canPostponeSplits|=unresolvedSplits.isEmpty();
  if(!canPostponeSplits) {

    while(!unresolvedSplits.isEmpty()) {
      UnresolvedSplitRecord urr=unresolvedSplits.pop();

      Node* node=*pnode;
      IntermediateNode* newNode = createIntermediateNode(node->term(), urr.var);
      node->setTerm(urr.original);

      *pnode=newNode;

      Node** nodePosition=newNode->childByTop(node->top(), true);
      ASS(!*nodePosition);
      *nodePosition=node;
    }
  }
#endif
  ASS(!(*pnode)->isLeaf());

  IntermediateNode* inode = static_cast<IntermediateNode*>(*pnode);
  ASS(inode);

  unsigned boundVar=inode->childVar;
  TermList term=svBindings.get(boundVar);
  svBindings.remove(boundVar);

  //Into pparent we store the node, we might be inserting into.
  //So in the case we do insert, we might check whether this node
  //needs expansion.
  Node** pparent=pnode;
  pnode=inode->childByTop(term.top(),true);

  if (*pnode == 0) {
    BinaryHeap<Binding, BindingComparator<LeafData_>> remainingBindings;
    for (auto [var, term] : iterTraits(svBindings.items())) {
      remainingBindings.insert(Binding(var, term));
    }
    while (!remainingBindings.isEmpty()) {
      Binding b=remainingBindings.pop();
      IntermediateNode* inode = createIntermediateNode(term, b.var);
      term=b.term;

      *pnode = inode;
      pnode = inode->childByTop(term.top(),true);
    }
    Leaf* lnode=createLeaf(term);
    *pnode=lnode;
    lnode->insert(ld);

    ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pparent));
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }


  TermList* tt = &term;
  TermList* ss = &(*pnode)->term();

  ASS(TermList::sameTop(*ss, *tt));


  // ss is the term in node, tt is the term to be inserted
  // ss and tt have the same top symbols but are not equal
  // create the common subterm of ss,tt and an alternative node
  Stack<TermList*> subterms(64);
  for (;;) {
    if (*tt!=*ss && TermList::sameTop(*ss,*tt)) {
      // ss and tt have the same tops and are different, so must be non-variables
      ASS(! ss->isVar());
      ASS(! tt->isVar());

      Term* s = ss->term();
      Term* t = tt->term();

      ASS(s->arity() > 0);
      ASS(s->functor() == t->functor());

      if (s->shared()) {
        // create a shallow copy of s
        s = Term::cloneNonShared(s);
        ss->setTerm(s);
      }

      ss = s->args();
      tt = t->args();
      if (ss->next()->isEmpty()) {
        continue;
      }
      subterms.push(ss->next());
      subterms.push(tt->next());
    } else {
      if (! TermList::sameTop(*ss,*tt)) {
        unsigned x;
        if(!ss->isSpecialVar()) {
          x = _nextVar++;
        #if REORDERING
          unresolvedSplits.insert(UnresolvedSplitRecord(x,*ss));
          ss->makeSpecialVar(x);
        #else
          Node::split(pnode,ss,x);
        #endif
        } else {
          x=ss->var();
        }
        svBindings.set(x,*tt);
      }

      if (subterms.isEmpty()) {
        break;
      }
      tt = subterms.pop();
      ss = subterms.pop();
      if (! ss->next()->isEmpty()) {
        subterms.push(ss->next());
        subterms.push(tt->next());
      }
    }
  }

  if (svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    Leaf* leaf = static_cast<Leaf*>(*pnode);
    leaf->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  goto start;
}